

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O0

Gia_Man_t * Gia_ManFaultUnfold(Gia_Man_t *p,int fUseMuxes,int fFfOnly)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Gia_Man_t *p_00;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  Gia_Man_t *p_01;
  bool bVar7;
  int local_e8;
  int iThis;
  int iCtrl;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  int fFfOnly_local;
  int fUseMuxes_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart((fUseMuxes * 3 + 2) * iVar1);
  pcVar5 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar5;
  Gia_ManHashAlloc(p_00);
  pGVar6 = Gia_ManConst0(p);
  pGVar6->Value = 0;
  iThis = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar7 = false;
    if (iThis < iVar1) {
      iVar1 = Gia_ManPiNum(p);
      _iCtrl = Gia_ManCi(p,iVar1 + iThis);
      bVar7 = _iCtrl != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    uVar2 = Gia_ManAppendCi(p_00);
    _iCtrl->Value = uVar2;
    iThis = iThis + 1;
  }
  iThis = 0;
  while( true ) {
    iVar1 = Gia_ManPiNum(p);
    bVar7 = false;
    if (iThis < iVar1) {
      _iCtrl = Gia_ManCi(p,iThis);
      bVar7 = _iCtrl != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    uVar2 = Gia_ManAppendCi(p_00);
    _iCtrl->Value = uVar2;
    iThis = iThis + 1;
  }
  iThis = 0;
  while( true ) {
    bVar7 = false;
    if (iThis < p->nObjs) {
      _iCtrl = Gia_ManObj(p,iThis);
      bVar7 = _iCtrl != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Gia_ObjIsAnd(_iCtrl);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFanin0Copy(_iCtrl);
      iVar3 = Gia_ObjFanin1Copy(_iCtrl);
      uVar2 = Gia_ManHashAnd(p_00,iVar1,iVar3);
      _iCtrl->Value = uVar2;
    }
    iThis = iThis + 1;
  }
  iThis = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar7 = false;
    if (iThis < iVar1) {
      _iCtrl = Gia_ManCo(p,iThis);
      bVar7 = _iCtrl != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    uVar2 = Gia_ObjFanin0Copy(_iCtrl);
    _iCtrl->Value = uVar2;
    iThis = iThis + 1;
  }
  iThis = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar7 = false;
    if (iThis < iVar1) {
      iVar1 = Gia_ManPiNum(p);
      _iCtrl = Gia_ManCi(p,iVar1 + iThis);
      bVar7 = _iCtrl != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    pGVar6 = Gia_ObjRoToRi(p,_iCtrl);
    _iCtrl->Value = pGVar6->Value;
    iThis = iThis + 1;
  }
  iThis = 0;
  while( true ) {
    iVar1 = Gia_ManPiNum(p);
    bVar7 = false;
    if (iThis < iVar1) {
      _iCtrl = Gia_ManCi(p,iThis);
      bVar7 = _iCtrl != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    uVar2 = Gia_ManAppendCi(p_00);
    _iCtrl->Value = uVar2;
    iThis = iThis + 1;
  }
  if (fFfOnly == 0) {
    iThis = 0;
    while( true ) {
      bVar7 = false;
      if (iThis < p->nObjs) {
        _iCtrl = Gia_ManObj(p,iThis);
        bVar7 = _iCtrl != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar1 = Gia_ObjIsAnd(_iCtrl);
      if (iVar1 != 0) {
        iVar1 = Gia_ManAppendCi(p_00);
        iVar3 = Gia_ObjFanin0Copy(_iCtrl);
        iVar4 = Gia_ObjFanin1Copy(_iCtrl);
        uVar2 = Gia_ManHashAnd(p_00,iVar3,iVar4);
        if (fUseMuxes == 0) {
          _iCtrl->Value = uVar2;
        }
        else {
          uVar2 = Gia_ManHashMux(p_00,iVar1,_iCtrl->Value,uVar2);
          _iCtrl->Value = uVar2;
        }
      }
      iThis = iThis + 1;
    }
    iThis = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCos);
      bVar7 = false;
      if (iThis < iVar1) {
        _iCtrl = Gia_ManCo(p,iThis);
        bVar7 = _iCtrl != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar1 = Gia_ObjFanin0Copy(_iCtrl);
      uVar2 = Gia_ManAppendCo(p_00,iVar1);
      _iCtrl->Value = uVar2;
      iThis = iThis + 1;
    }
  }
  else {
    iThis = 0;
    while( true ) {
      bVar7 = false;
      if (iThis < p->nObjs) {
        _iCtrl = Gia_ManObj(p,iThis);
        bVar7 = _iCtrl != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar1 = Gia_ObjIsAnd(_iCtrl);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjFanin0Copy(_iCtrl);
        iVar3 = Gia_ObjFanin1Copy(_iCtrl);
        uVar2 = Gia_ManHashAnd(p_00,iVar1,iVar3);
        _iCtrl->Value = uVar2;
      }
      iThis = iThis + 1;
    }
    iThis = 0;
    while( true ) {
      iVar1 = Gia_ManPoNum(p);
      bVar7 = false;
      if (iThis < iVar1) {
        _iCtrl = Gia_ManCo(p,iThis);
        bVar7 = _iCtrl != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar1 = Gia_ObjFanin0Copy(_iCtrl);
      uVar2 = Gia_ManAppendCo(p_00,iVar1);
      _iCtrl->Value = uVar2;
      iThis = iThis + 1;
    }
    iThis = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(p);
      bVar7 = false;
      if (iThis < iVar1) {
        iVar1 = Gia_ManPoNum(p);
        _iCtrl = Gia_ManCo(p,iVar1 + iThis);
        bVar7 = _iCtrl != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar1 = Gia_ManAppendCi(p_00);
      uVar2 = Gia_ObjFanin0Copy(_iCtrl);
      if (fUseMuxes == 0) {
        _iCtrl->Value = uVar2;
      }
      else {
        uVar2 = Gia_ManHashMux(p_00,iVar1,_iCtrl->Value,uVar2);
        _iCtrl->Value = uVar2;
      }
      uVar2 = Gia_ManAppendCo(p_00,_iCtrl->Value);
      _iCtrl->Value = uVar2;
      iThis = iThis + 1;
    }
  }
  p_01 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  iVar1 = Gia_ManPiNum(p_01);
  iVar3 = Gia_ManRegNum(p);
  iVar4 = Gia_ManPiNum(p);
  if (fFfOnly == 0) {
    local_e8 = Gia_ManAndNum(p);
  }
  else {
    local_e8 = Gia_ManRegNum(p);
  }
  if (iVar1 != iVar3 + iVar4 * 2 + local_e8) {
    __assert_fail("Gia_ManPiNum(pNew) == Gia_ManRegNum(p) + 2 * Gia_ManPiNum(p) + (fFfOnly ? Gia_ManRegNum(p) : Gia_ManAndNum(p))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                  ,0x177,"Gia_Man_t *Gia_ManFaultUnfold(Gia_Man_t *, int, int)");
  }
  return p_01;
}

Assistant:

Gia_Man_t * Gia_ManFaultUnfold( Gia_Man_t * p, int fUseMuxes, int fFfOnly )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iCtrl, iThis;
    pNew = Gia_ManStart( (2 + 3 * fUseMuxes) * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    // add first timeframe
    Gia_ManForEachRo( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy(pObj);
    // add second timeframe
    Gia_ManForEachRo( p, pObj, i )
        pObj->Value = Gia_ObjRoToRi(p, pObj)->Value;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    if ( fFfOnly )
    {
        Gia_ManForEachAnd( p, pObj, i )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachPo( p, pObj, i )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        Gia_ManForEachRi( p, pObj, i )
        {
            iCtrl = Gia_ManAppendCi(pNew);
            iThis = Gia_ObjFanin0Copy(pObj);
            if ( fUseMuxes )
                pObj->Value = Gia_ManHashMux( pNew, iCtrl, pObj->Value, iThis );
            else
                pObj->Value = iThis;
            pObj->Value = Gia_ManAppendCo( pNew, pObj->Value );
        }
    }
    else
    {
        Gia_ManForEachAnd( p, pObj, i )
        {
            iCtrl = Gia_ManAppendCi(pNew);
            iThis = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
            if ( fUseMuxes )
                pObj->Value = Gia_ManHashMux( pNew, iCtrl, pObj->Value, iThis );
            else
                pObj->Value = iThis;
        }
        Gia_ManForEachCo( p, pObj, i )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNew) == Gia_ManRegNum(p) + 2 * Gia_ManPiNum(p) + (fFfOnly ? Gia_ManRegNum(p) : Gia_ManAndNum(p)) );
    return pNew;
}